

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O1

CURLproxycode
Curl_SOCKS5(char *proxy_user,char *proxy_password,char *hostname,int remote_port,int sockindex,
           Curl_easy *data,_Bool *done)

{
  uchar **ppuVar1;
  uchar uVar2;
  byte bVar3;
  curl_socket_t sockfd;
  connect_t cVar4;
  connectdata *pcVar5;
  byte *mem;
  sockaddr *psVar6;
  connectdata *pcVar7;
  bool bVar8;
  uint uVar9;
  resolve_t rVar10;
  int iVar11;
  CURLcode CVar12;
  char *pcVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  CURLproxycode CVar18;
  Curl_addrinfo *ai;
  char *pcVar19;
  int code;
  size_t __n;
  bool bVar20;
  ssize_t written;
  ssize_t actualread;
  Curl_dns_entry *dns;
  uchar ip4 [4];
  char dest [256];
  CURLproxycode local_180;
  long local_168;
  long local_160;
  Curl_dns_entry *local_158;
  char *local_150;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined8 uStack_140;
  char local_138 [264];
  
  pcVar5 = data->conn;
  mem = (byte *)(data->state).buffer;
  local_150 = proxy_password;
  memcpy(local_138,"unknown",0x100);
  sockfd = pcVar5->sock[sockindex];
  uVar2 = (pcVar5->socks_proxy).proxytype;
  bVar20 = uVar2 == '\x05';
  pcVar13 = (char *)strlen(hostname);
  uVar15 = (data->set).socks5auth;
  local_158 = (Curl_dns_entry *)0x0;
  cVar4 = (pcVar5->cnnct).state;
  if (((0xf < cVar4 - CONNECT_SOCKS_INIT) && (cVar4 != CONNECT_SOCKS_INIT)) && (*done == false)) {
    (pcVar5->cnnct).state = CONNECT_SOCKS_INIT;
  }
  switch((pcVar5->cnnct).state) {
  case CONNECT_SOCKS_INIT:
    if (((pcVar5->bits).field_0x4 & 1) != 0) {
      Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",hostname,
                 (ulong)(uint)remote_port);
    }
    bVar8 = (char *)0xff < pcVar13 && uVar2 != '\x05';
    if (bVar8) {
      Curl_infof(data,
                 "SOCKS5: server resolving disabled for hostnames of length > 255 [actual len=%zu]",
                 pcVar13);
    }
    bVar20 = bVar8 || bVar20;
    if ((uVar15 & 0xfffffffffffffffa) != 0) {
      Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu",uVar15);
    }
    *mem = 5;
    mem[2] = 0;
    proxy_user = (char *)((ulong)proxy_user & -(ulong)((uint)uVar15 & 1));
    if (proxy_user == (char *)0x0) {
      uVar9 = 3;
    }
    else {
      mem[3] = 2;
      uVar9 = 4;
    }
    mem[1] = (char)uVar9 - 2;
    CVar12 = Curl_write_plain(data,sockfd,mem,(ulong)uVar9,&local_168);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
LAB_005b213a:
      Curl_failf(data,"Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    pcVar7 = data->conn;
    cVar4 = (pcVar7->cnnct).state;
    lVar16 = (ulong)uVar9 - local_168;
    if (lVar16 != 0) {
      if (cVar4 != CONNECT_SOCKS_SEND) {
        (pcVar7->cnnct).state = CONNECT_SOCKS_SEND;
      }
      (pcVar5->cnnct).outstanding = lVar16;
      (pcVar5->cnnct).outp = mem + local_168;
      return CURLPX_OK;
    }
    if (cVar4 != CONNECT_SOCKS_READ) {
      (pcVar7->cnnct).state = CONNECT_SOCKS_READ;
    }
    break;
  case CONNECT_SOCKS_SEND:
    CVar12 = Curl_write_plain(data,sockfd,(pcVar5->cnnct).outp,(pcVar5->cnnct).outstanding,
                              &local_168);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) goto LAB_005b213a;
    lVar17 = (pcVar5->cnnct).outstanding - local_168;
    lVar16 = local_168;
    if (lVar17 != 0) goto LAB_005b26ee;
    break;
  case CONNECT_SOCKS_READ_INIT:
    break;
  case CONNECT_SOCKS_READ:
    goto LAB_005b208d;
  default:
    goto switchD_005b1c71_caseD_5;
  case CONNECT_AUTH_INIT:
    goto switchD_005b1c71_caseD_6;
  case CONNECT_AUTH_SEND:
    pcVar19 = (char *)0x0;
    goto LAB_005b253a;
  case CONNECT_AUTH_READ:
    pcVar19 = (char *)0x0;
    goto LAB_005b2590;
  case CONNECT_REQ_INIT:
    pcVar19 = (char *)0x0;
    goto LAB_005b1d1e;
  case CONNECT_RESOLVING:
    local_158 = Curl_fetch_addr(data,hostname,remote_port);
    if (local_158 != (Curl_dns_entry *)0x0) {
      Curl_infof(data,"SOCKS5: hostname \'%s\' found",hostname);
    }
    if ((local_158 == (Curl_dns_entry *)0x0) &&
       (CVar12 = Curl_resolv_check(data,&local_158), local_158 == (Curl_dns_entry *)0x0)) {
      if (CVar12 == CURLE_OK) {
        return CURLPX_OK;
      }
      return CURLPX_RESOLVE_HOST;
    }
  case CONNECT_RESOLVED:
    pcVar19 = (char *)0x0;
    goto LAB_005b1e32;
  case CONNECT_RESOLVE_REMOTE:
    goto LAB_005b1d7a;
  case CONNECT_REQ_SEND:
    pcVar19 = (char *)0x0;
    goto LAB_005b21d2;
  case CONNECT_REQ_SENDING:
    goto switchD_005b1c71_caseD_e;
  case CONNECT_REQ_READ:
    goto switchD_005b1c71_caseD_f;
  case CONNECT_REQ_READ_MORE:
    goto switchD_005b1c71_caseD_10;
  }
  (pcVar5->cnnct).outstanding = 2;
  (pcVar5->cnnct).outp = mem;
LAB_005b208d:
  CVar12 = Curl_read_plain(sockfd,(char *)(pcVar5->cnnct).outp,(pcVar5->cnnct).outstanding,
                           &local_160);
  if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
    Curl_failf(data,"Unable to receive initial SOCKS5 response.");
    return CURLPX_RECV_CONNECT;
  }
  if (local_160 == 0 && CVar12 == CURLE_OK) {
    pcVar13 = "Connection to proxy closed";
    goto LAB_005b2702;
  }
  lVar17 = (pcVar5->cnnct).outstanding - local_160;
  lVar16 = local_160;
  if (lVar17 != 0) goto LAB_005b26ee;
  if (*mem != 5) {
    pcVar13 = "Received invalid version in initial SOCKS5 response.";
    goto LAB_005b2328;
  }
  bVar3 = mem[1];
  if (bVar3 < 2) {
    if (bVar3 != 0) {
      if (bVar3 == 1) {
        Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
        return CURLPX_GSSAPI_PERMSG;
      }
LAB_005b23d0:
      Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
      return CURLPX_UNKNOWN_MODE;
    }
    pcVar7 = data->conn;
    pcVar19 = (char *)0x0;
    cVar4 = (pcVar7->cnnct).state;
joined_r0x005b263f:
    if (cVar4 != CONNECT_REQ_INIT) {
      (pcVar7->cnnct).state = CONNECT_REQ_INIT;
    }
LAB_005b1d1e:
    if (bVar20) {
      bVar20 = false;
      rVar10 = Curl_resolv(data,hostname,remote_port,false,&local_158);
      if (rVar10 == CURLRESOLV_ERROR) {
        proxy_user = (char *)0x1b;
      }
      else if (rVar10 == CURLRESOLV_PENDING) {
        bVar20 = false;
        proxy_user = (char *)0x0;
        if ((data->conn->cnnct).state != CONNECT_RESOLVING) {
          (data->conn->cnnct).state = CONNECT_RESOLVING;
          bVar20 = false;
          proxy_user = (char *)0x0;
        }
      }
      else {
        bVar20 = true;
        if ((data->conn->cnnct).state != CONNECT_RESOLVED) {
          (data->conn->cnnct).state = CONNECT_RESOLVED;
        }
      }
      if (!bVar20) {
        return (CURLproxycode)proxy_user;
      }
LAB_005b1e32:
      local_180 = (CURLproxycode)proxy_user;
      if (local_158 == (Curl_dns_entry *)0x0) {
        ai = (Curl_addrinfo *)0x0;
      }
      else {
        ai = local_158->addr;
      }
      if (ai == (Curl_addrinfo *)0x0) {
        Curl_failf(data,"Failed to resolve \"%s\" for SOCKS5 connect.",hostname);
        local_180 = CURLPX_RESOLVE_HOST;
      }
      else {
        Curl_printable_address(ai,local_138,0x100);
        sVar14 = strlen(local_138);
        curl_msnprintf(local_138 + sVar14,0x100 - sVar14,":%d");
        mem[0] = 5;
        mem[1] = 1;
        mem[2] = 0;
        if (ai->ai_family == 10) {
          mem[3] = 4;
          psVar6 = ai->ai_addr;
          lVar16 = 0;
          do {
            mem[lVar16 + 4] = psVar6->sa_data[lVar16 + 6];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x10);
          Curl_infof(data,"SOCKS5 connect to IPv6 %s (locally resolved)",local_138);
          pcVar19 = &DAT_00000014;
        }
        else if (ai->ai_family == 2) {
          mem[3] = 1;
          psVar6 = ai->ai_addr;
          lVar16 = 0;
          do {
            mem[lVar16 + 4] = psVar6->sa_data[lVar16 + 2];
            lVar16 = lVar16 + 1;
          } while (lVar16 != 4);
          Curl_infof(data,"SOCKS5 connect to IPv4 %s (locally resolved)",local_138);
          pcVar19 = (char *)0x8;
        }
        else {
          Curl_failf(data,"SOCKS5 connection to %s not supported",local_138);
          pcVar19 = (char *)0x3;
        }
        Curl_resolv_unlock(data,local_158);
      }
      if (ai == (Curl_addrinfo *)0x0) {
        return local_180;
      }
    }
    else {
LAB_005b1d7a:
      CVar18 = (CURLproxycode)proxy_user;
      mem[0] = 5;
      mem[1] = 1;
      mem[2] = 0;
      pcVar19 = (char *)0x3;
      if (!bVar20) {
        if (((pcVar5->bits).field_0x5 & 8) == 0) {
          iVar11 = inet_pton(2,hostname,&local_148);
          if (iVar11 == 1) {
            mem[3] = 1;
            *(undefined4 *)(mem + 4) = local_148;
            pcVar19 = (char *)0x8;
          }
          else {
            mem[3] = 3;
            mem[4] = (byte)pcVar13;
            memcpy(mem + 5,hostname,(size_t)pcVar13);
            pcVar19 = pcVar13 + 5;
          }
LAB_005b21ac:
          Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",hostname,
                     (ulong)(uint)remote_port);
          bVar20 = true;
        }
        else {
          iVar11 = inet_pton(10,hostname,&local_148);
          if (iVar11 == 1) {
            mem[3] = 4;
            *(ulong *)(mem + 4) = CONCAT44(uStack_144,local_148);
            *(undefined8 *)(mem + 0xc) = uStack_140;
            pcVar19 = &DAT_00000014;
            goto LAB_005b21ac;
          }
          CVar18 = CURLPX_BAD_ADDRESS_TYPE;
          pcVar19 = (char *)0x3;
          bVar20 = false;
        }
        if (!bVar20) {
          return CVar18;
        }
      }
    }
LAB_005b21d2:
    *(ushort *)(mem + (long)pcVar19) = (ushort)remote_port << 8 | (ushort)remote_port >> 8;
    (pcVar5->cnnct).outp = mem;
    (pcVar5->cnnct).outstanding = (ssize_t)(pcVar19 + 2);
    if ((data->conn->cnnct).state != CONNECT_REQ_SENDING) {
      (data->conn->cnnct).state = CONNECT_REQ_SENDING;
    }
switchD_005b1c71_caseD_e:
    CVar12 = Curl_write_plain(data,sockfd,(pcVar5->cnnct).outp,(pcVar5->cnnct).outstanding,
                              &local_168);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
      Curl_failf(data,"Failed to send SOCKS5 connect request.");
      return CURLPX_SEND_REQUEST;
    }
    lVar17 = (pcVar5->cnnct).outstanding - local_168;
    lVar16 = local_168;
    if (lVar17 != 0) {
LAB_005b26ee:
      (pcVar5->cnnct).outstanding = lVar17;
      ppuVar1 = &(pcVar5->cnnct).outp;
      *ppuVar1 = *ppuVar1 + lVar16;
      return CURLPX_OK;
    }
    (pcVar5->cnnct).outstanding = 10;
    (pcVar5->cnnct).outp = mem;
    if ((data->conn->cnnct).state != CONNECT_REQ_READ) {
      (data->conn->cnnct).state = CONNECT_REQ_READ;
    }
switchD_005b1c71_caseD_f:
    CVar12 = Curl_read_plain(sockfd,(char *)(pcVar5->cnnct).outp,(pcVar5->cnnct).outstanding,
                             &local_160);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
      Curl_failf(data,"Failed to receive SOCKS5 connect request ack.");
      return CURLPX_RECV_REQACK;
    }
    if (local_160 != 0 || CVar12 != CURLE_OK) {
      lVar17 = (pcVar5->cnnct).outstanding - local_160;
      lVar16 = local_160;
      if (lVar17 != 0) goto LAB_005b26ee;
      if (*mem != 5) {
        pcVar13 = "SOCKS5 reply has wrong version, version should be 5.";
LAB_005b2328:
        Curl_failf(data,pcVar13);
        return CURLPX_BAD_VERSION;
      }
      bVar3 = mem[1];
      if (bVar3 != 0) {
        Curl_failf(data,"Can\'t complete SOCKS5 connection to %s. (%d)",hostname,(ulong)bVar3);
        if (bVar3 < 9) {
          return Curl_SOCKS5::lookup[bVar3];
        }
        return CURLPX_REPLY_UNASSIGNED;
      }
      bVar3 = mem[3];
      if (bVar3 == 1) {
        uVar15 = 10;
      }
      else if (bVar3 == 4) {
        uVar15 = 0x16;
      }
      else {
        if (bVar3 != 3) {
          Curl_failf(data,"SOCKS5 reply has wrong address type.");
          return CURLPX_BAD_ADDRESS_TYPE;
        }
        uVar15 = (ulong)mem[4] + 7;
      }
      if (10 < uVar15) {
        (pcVar5->cnnct).outstanding = uVar15 - 10;
        (pcVar5->cnnct).outp = mem + 10;
        if ((data->conn->cnnct).state != CONNECT_REQ_READ_MORE) {
          (data->conn->cnnct).state = CONNECT_REQ_READ_MORE;
        }
switchD_005b1c71_caseD_10:
        CVar12 = Curl_read_plain(sockfd,(char *)(pcVar5->cnnct).outp,(pcVar5->cnnct).outstanding,
                                 &local_160);
        if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
          Curl_failf(data,"Failed to receive SOCKS5 connect request ack.");
          return CURLPX_RECV_ADDRESS;
        }
        if (local_160 == 0 && CVar12 == CURLE_OK) goto LAB_005b26fb;
        lVar17 = (pcVar5->cnnct).outstanding - local_160;
        lVar16 = local_160;
        if (lVar17 != 0) goto LAB_005b26ee;
      }
      if ((data->conn->cnnct).state != CONNECT_DONE) {
        (data->conn->cnnct).state = CONNECT_DONE;
      }
switchD_005b1c71_caseD_5:
      Curl_infof(data,"SOCKS5 request granted.");
      *done = true;
      return CURLPX_OK;
    }
  }
  else {
    if (bVar3 != 2) {
      if (bVar3 == 0xff) {
        Curl_failf(data,"No authentication method was acceptable.");
        return CURLPX_NO_AUTH;
      }
      goto LAB_005b23d0;
    }
    if ((data->conn->cnnct).state != CONNECT_AUTH_INIT) {
      (data->conn->cnnct).state = CONNECT_AUTH_INIT;
    }
switchD_005b1c71_caseD_6:
    sVar14 = 0;
    if (local_150 == (char *)0x0) {
      __n = 0;
    }
    else {
      __n = 0;
      if (proxy_user != (char *)0x0) {
        sVar14 = strlen(proxy_user);
        __n = strlen(local_150);
      }
    }
    *mem = 1;
    mem[1] = (byte)sVar14;
    if (sVar14 == 0 || proxy_user == (char *)0x0) {
LAB_005b24b6:
      mem[sVar14 + 2] = (byte)__n;
      pcVar19 = (char *)(sVar14 + 3);
      if (__n != 0 && local_150 != (char *)0x0) {
        if (0xff < __n) {
          bVar8 = false;
          Curl_failf(data,"Excessive password length for proxy auth");
          proxy_user = (char *)0xa;
          goto LAB_005b2531;
        }
        memcpy(mem + (long)pcVar19,local_150,__n);
        proxy_user = pcVar13;
      }
      pcVar19 = pcVar19 + __n;
      if ((data->conn->cnnct).state != CONNECT_AUTH_SEND) {
        (data->conn->cnnct).state = CONNECT_AUTH_SEND;
      }
      (pcVar5->cnnct).outstanding = (ssize_t)pcVar19;
      (pcVar5->cnnct).outp = mem;
      bVar8 = true;
    }
    else {
      if (sVar14 < 0xff) {
        memcpy(mem + 2,proxy_user,sVar14);
        goto LAB_005b24b6;
      }
      bVar8 = false;
      Curl_failf(data,"Excessive user name length for proxy auth");
      proxy_user = (char *)0xb;
      pcVar19 = &DAT_00000002;
    }
LAB_005b2531:
    if (!bVar8) {
      return (CURLproxycode)proxy_user;
    }
LAB_005b253a:
    CVar12 = Curl_write_plain(data,sockfd,(pcVar5->cnnct).outp,(pcVar5->cnnct).outstanding,
                              &local_168);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
      Curl_failf(data,"Failed to send SOCKS5 sub-negotiation request.");
      return CURLPX_SEND_AUTH;
    }
    lVar17 = (pcVar5->cnnct).outstanding - local_168;
    lVar16 = local_168;
    if (lVar17 != 0) goto LAB_005b26ee;
    (pcVar5->cnnct).outp = mem;
    (pcVar5->cnnct).outstanding = 2;
    if ((data->conn->cnnct).state != CONNECT_AUTH_READ) {
      (data->conn->cnnct).state = CONNECT_AUTH_READ;
    }
LAB_005b2590:
    CVar12 = Curl_read_plain(sockfd,(char *)(pcVar5->cnnct).outp,(pcVar5->cnnct).outstanding,
                             &local_160);
    if ((CVar12 != CURLE_OK) && (CVar12 != CURLE_AGAIN)) {
      Curl_failf(data,"Unable to receive SOCKS5 sub-negotiation response.");
      return CURLPX_RECV_AUTH;
    }
    if (local_160 != 0 || CVar12 != CURLE_OK) {
      lVar17 = (pcVar5->cnnct).outstanding - local_160;
      lVar16 = local_160;
      if (lVar17 != 0) goto LAB_005b26ee;
      if (mem[1] != 0) {
        Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*mem);
        return CURLPX_USER_REJECTED;
      }
      pcVar7 = data->conn;
      cVar4 = (pcVar7->cnnct).state;
      goto joined_r0x005b263f;
    }
  }
LAB_005b26fb:
  pcVar13 = "connection to proxy closed";
LAB_005b2702:
  Curl_failf(data,pcVar13);
  return CURLPX_CLOSED;
}

Assistant:

CURLproxycode Curl_SOCKS5(const char *proxy_user,
                          const char *proxy_password,
                          const char *hostname,
                          int remote_port,
                          int sockindex,
                          struct Curl_easy *data,
                          bool *done)
{
  /*
    According to the RFC1928, section "6.  Replies". This is what a SOCK5
    replies:

        +----+-----+-------+------+----------+----------+
        |VER | REP |  RSV  | ATYP | BND.ADDR | BND.PORT |
        +----+-----+-------+------+----------+----------+
        | 1  |  1  | X'00' |  1   | Variable |    2     |
        +----+-----+-------+------+----------+----------+

    Where:

    o  VER    protocol version: X'05'
    o  REP    Reply field:
    o  X'00' succeeded
  */
  struct connectdata *conn = data->conn;
  unsigned char *socksreq = (unsigned char *)data->state.buffer;
  char dest[256] = "unknown";  /* printable hostname:port */
  int idx;
  ssize_t actualread;
  ssize_t written;
  CURLcode result;
  curl_socket_t sockfd = conn->sock[sockindex];
  bool socks5_resolve_local =
    (conn->socks_proxy.proxytype == CURLPROXY_SOCKS5) ? TRUE : FALSE;
  const size_t hostname_len = strlen(hostname);
  ssize_t len = 0;
  const unsigned long auth = data->set.socks5auth;
  bool allow_gssapi = FALSE;
  struct connstate *sx = &conn->cnnct;
  struct Curl_dns_entry *dns = NULL;

  if(!SOCKS_STATE(sx->state) && !*done)
    sxstate(data, CONNECT_SOCKS_INIT);

  switch(sx->state) {
  case CONNECT_SOCKS_INIT:
    if(conn->bits.httpproxy)
      infof(data, "SOCKS5: connecting to HTTP proxy %s port %d",
            hostname, remote_port);

    /* RFC1928 chapter 5 specifies max 255 chars for domain name in packet */
    if(!socks5_resolve_local && hostname_len > 255) {
      infof(data, "SOCKS5: server resolving disabled for hostnames of "
            "length > 255 [actual len=%zu]", hostname_len);
      socks5_resolve_local = TRUE;
    }

    if(auth & ~(CURLAUTH_BASIC | CURLAUTH_GSSAPI))
      infof(data,
            "warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %lu",
            auth);
    if(!(auth & CURLAUTH_BASIC))
      /* disable username/password auth */
      proxy_user = NULL;
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(auth & CURLAUTH_GSSAPI)
      allow_gssapi = TRUE;
#endif

    idx = 0;
    socksreq[idx++] = 5;   /* version */
    idx++;                 /* number of authentication methods */
    socksreq[idx++] = 0;   /* no authentication */
    if(allow_gssapi)
      socksreq[idx++] = 1; /* GSS-API */
    if(proxy_user)
      socksreq[idx++] = 2; /* username/password */
    /* write the number of authentication methods */
    socksreq[1] = (unsigned char) (idx - 2);

    result = Curl_write_plain(data, sockfd, (char *)socksreq, idx, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    if(written != idx) {
      sxstate(data, CONNECT_SOCKS_SEND);
      sx->outstanding = idx - written;
      sx->outp = &socksreq[written];
      return CURLPX_OK;
    }
    sxstate(data, CONNECT_SOCKS_READ);
    goto CONNECT_SOCKS_READ_INIT;
  case CONNECT_SOCKS_SEND:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to send initial SOCKS5 request.");
      return CURLPX_SEND_CONNECT;
    }
    if(written != sx->outstanding) {
      /* not done, remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
    /* FALLTHROUGH */
  CONNECT_SOCKS_READ_INIT:
  case CONNECT_SOCKS_READ_INIT:
    sx->outstanding = 2; /* expect two bytes */
    sx->outp = socksreq; /* store it here */
    /* FALLTHROUGH */
  case CONNECT_SOCKS_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to receive initial SOCKS5 response.");
      return CURLPX_RECV_CONNECT;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "Connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in reading state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    else if(socksreq[0] != 5) {
      failf(data, "Received invalid version in initial SOCKS5 response.");
      return CURLPX_BAD_VERSION;
    }
    else if(socksreq[1] == 0) {
      /* DONE! No authentication needed. Send request. */
      sxstate(data, CONNECT_REQ_INIT);
      goto CONNECT_REQ_INIT;
    }
    else if(socksreq[1] == 2) {
      /* regular name + password authentication */
      sxstate(data, CONNECT_AUTH_INIT);
      goto CONNECT_AUTH_INIT;
    }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    else if(allow_gssapi && (socksreq[1] == 1)) {
      sxstate(data, CONNECT_GSSAPI_INIT);
      result = Curl_SOCKS5_gssapi_negotiate(sockindex, data);
      if(result) {
        failf(data, "Unable to negotiate SOCKS5 GSS-API context.");
        return CURLPX_GSSAPI;
      }
    }
#endif
    else {
      /* error */
      if(!allow_gssapi && (socksreq[1] == 1)) {
        failf(data,
              "SOCKS5 GSSAPI per-message authentication is not supported.");
        return CURLPX_GSSAPI_PERMSG;
      }
      else if(socksreq[1] == 255) {
        failf(data, "No authentication method was acceptable.");
        return CURLPX_NO_AUTH;
      }
    }
    failf(data,
          "Undocumented SOCKS5 mode attempted to be used by server.");
    return CURLPX_UNKNOWN_MODE;
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  case CONNECT_GSSAPI_INIT:
    /* GSSAPI stuff done non-blocking */
    break;
#endif

  default: /* do nothing! */
    break;

  CONNECT_AUTH_INIT:
  case CONNECT_AUTH_INIT: {
    /* Needs user name and password */
    size_t proxy_user_len, proxy_password_len;
    if(proxy_user && proxy_password) {
      proxy_user_len = strlen(proxy_user);
      proxy_password_len = strlen(proxy_password);
    }
    else {
      proxy_user_len = 0;
      proxy_password_len = 0;
    }

    /*   username/password request looks like
     * +----+------+----------+------+----------+
     * |VER | ULEN |  UNAME   | PLEN |  PASSWD  |
     * +----+------+----------+------+----------+
     * | 1  |  1   | 1 to 255 |  1   | 1 to 255 |
     * +----+------+----------+------+----------+
     */
    len = 0;
    socksreq[len++] = 1;    /* username/pw subnegotiation version */
    socksreq[len++] = (unsigned char) proxy_user_len;
    if(proxy_user && proxy_user_len) {
      /* the length must fit in a single byte */
      if(proxy_user_len >= 255) {
        failf(data, "Excessive user name length for proxy auth");
        return CURLPX_LONG_USER;
      }
      memcpy(socksreq + len, proxy_user, proxy_user_len);
    }
    len += proxy_user_len;
    socksreq[len++] = (unsigned char) proxy_password_len;
    if(proxy_password && proxy_password_len) {
      /* the length must fit in a single byte */
      if(proxy_password_len > 255) {
        failf(data, "Excessive password length for proxy auth");
        return CURLPX_LONG_PASSWD;
      }
      memcpy(socksreq + len, proxy_password, proxy_password_len);
    }
    len += proxy_password_len;
    sxstate(data, CONNECT_AUTH_SEND);
    sx->outstanding = len;
    sx->outp = socksreq;
  }
    /* FALLTHROUGH */
  case CONNECT_AUTH_SEND:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to send SOCKS5 sub-negotiation request.");
      return CURLPX_SEND_AUTH;
    }
    if(sx->outstanding != written) {
      /* remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
    sx->outp = socksreq;
    sx->outstanding = 2;
    sxstate(data, CONNECT_AUTH_READ);
    /* FALLTHROUGH */
  case CONNECT_AUTH_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Unable to receive SOCKS5 sub-negotiation response.");
      return CURLPX_RECV_AUTH;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    /* ignore the first (VER) byte */
    else if(socksreq[1]) { /* status */
      failf(data, "User was rejected by the SOCKS5 server (%d %d).",
            socksreq[0], socksreq[1]);
      return CURLPX_USER_REJECTED;
    }

    /* Everything is good so far, user was authenticated! */
    sxstate(data, CONNECT_REQ_INIT);
    /* FALLTHROUGH */
  CONNECT_REQ_INIT:
  case CONNECT_REQ_INIT:
    if(socks5_resolve_local) {
      enum resolve_t rc = Curl_resolv(data, hostname, remote_port,
                                      FALSE, &dns);

      if(rc == CURLRESOLV_ERROR)
        return CURLPX_RESOLVE_HOST;

      if(rc == CURLRESOLV_PENDING) {
        sxstate(data, CONNECT_RESOLVING);
        return CURLPX_OK;
      }
      sxstate(data, CONNECT_RESOLVED);
      goto CONNECT_RESOLVED;
    }
    goto CONNECT_RESOLVE_REMOTE;

  case CONNECT_RESOLVING:
    /* check if we have the name resolved by now */
    dns = Curl_fetch_addr(data, hostname, remote_port);

    if(dns) {
#ifdef CURLRES_ASYNCH
      data->state.async.dns = dns;
      data->state.async.done = TRUE;
#endif
      infof(data, "SOCKS5: hostname '%s' found", hostname);
    }

    if(!dns) {
      result = Curl_resolv_check(data, &dns);
      if(!dns) {
        if(result)
          return CURLPX_RESOLVE_HOST;
        return CURLPX_OK;
      }
    }
    /* FALLTHROUGH */
  CONNECT_RESOLVED:
  case CONNECT_RESOLVED: {
    struct Curl_addrinfo *hp = NULL;
    size_t destlen;
    if(dns)
      hp = dns->addr;
    if(!hp) {
      failf(data, "Failed to resolve \"%s\" for SOCKS5 connect.",
            hostname);
      return CURLPX_RESOLVE_HOST;
    }

    Curl_printable_address(hp, dest, sizeof(dest));
    destlen = strlen(dest);
    msnprintf(dest + destlen, sizeof(dest) - destlen, ":%d", remote_port);

    len = 0;
    socksreq[len++] = 5; /* version (SOCKS5) */
    socksreq[len++] = 1; /* connect */
    socksreq[len++] = 0; /* must be zero */
    if(hp->ai_family == AF_INET) {
      int i;
      struct sockaddr_in *saddr_in;
      socksreq[len++] = 1; /* ATYP: IPv4 = 1 */

      saddr_in = (struct sockaddr_in *)(void *)hp->ai_addr;
      for(i = 0; i < 4; i++) {
        socksreq[len++] = ((unsigned char *)&saddr_in->sin_addr.s_addr)[i];
      }

      infof(data, "SOCKS5 connect to IPv4 %s (locally resolved)", dest);
    }
#ifdef ENABLE_IPV6
    else if(hp->ai_family == AF_INET6) {
      int i;
      struct sockaddr_in6 *saddr_in6;
      socksreq[len++] = 4; /* ATYP: IPv6 = 4 */

      saddr_in6 = (struct sockaddr_in6 *)(void *)hp->ai_addr;
      for(i = 0; i < 16; i++) {
        socksreq[len++] =
          ((unsigned char *)&saddr_in6->sin6_addr.s6_addr)[i];
      }

      infof(data, "SOCKS5 connect to IPv6 %s (locally resolved)", dest);
    }
#endif
    else {
      hp = NULL; /* fail! */
      failf(data, "SOCKS5 connection to %s not supported", dest);
    }

    Curl_resolv_unlock(data, dns); /* not used anymore from now on */
    goto CONNECT_REQ_SEND;
  }
  CONNECT_RESOLVE_REMOTE:
  case CONNECT_RESOLVE_REMOTE:
    /* Authentication is complete, now specify destination to the proxy */
    len = 0;
    socksreq[len++] = 5; /* version (SOCKS5) */
    socksreq[len++] = 1; /* connect */
    socksreq[len++] = 0; /* must be zero */

    if(!socks5_resolve_local) {
      /* ATYP: domain name = 3,
         IPv6 == 4,
         IPv4 == 1 */
      unsigned char ip4[4];
#ifdef ENABLE_IPV6
      if(conn->bits.ipv6_ip) {
        char ip6[16];
        if(1 != Curl_inet_pton(AF_INET6, hostname, ip6))
          return CURLPX_BAD_ADDRESS_TYPE;
        socksreq[len++] = 4;
        memcpy(&socksreq[len], ip6, sizeof(ip6));
        len += sizeof(ip6);
      }
      else
#endif
      if(1 == Curl_inet_pton(AF_INET, hostname, ip4)) {
        socksreq[len++] = 1;
        memcpy(&socksreq[len], ip4, sizeof(ip4));
        len += sizeof(ip4);
      }
      else {
        socksreq[len++] = 3;
        socksreq[len++] = (char) hostname_len; /* one byte address length */
        memcpy(&socksreq[len], hostname, hostname_len); /* address w/o NULL */
        len += hostname_len;
      }
      infof(data, "SOCKS5 connect to %s:%d (remotely resolved)",
            hostname, remote_port);
    }
    /* FALLTHROUGH */

  CONNECT_REQ_SEND:
  case CONNECT_REQ_SEND:
    /* PORT MSB */
    socksreq[len++] = (unsigned char)((remote_port >> 8) & 0xff);
    /* PORT LSB */
    socksreq[len++] = (unsigned char)(remote_port & 0xff);

#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(conn->socks5_gssapi_enctype) {
      failf(data, "SOCKS5 GSS-API protection not yet implemented.");
      return CURLPX_GSSAPI_PROTECTION;
    }
#endif
    sx->outp = socksreq;
    sx->outstanding = len;
    sxstate(data, CONNECT_REQ_SENDING);
    /* FALLTHROUGH */
  case CONNECT_REQ_SENDING:
    result = Curl_write_plain(data, sockfd, (char *)sx->outp,
                              sx->outstanding, &written);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to send SOCKS5 connect request.");
      return CURLPX_SEND_REQUEST;
    }
    if(sx->outstanding != written) {
      /* remain in state */
      sx->outstanding -= written;
      sx->outp += written;
      return CURLPX_OK;
    }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(conn->socks5_gssapi_enctype) {
      failf(data, "SOCKS5 GSS-API protection not yet implemented.");
      return CURLPX_GSSAPI_PROTECTION;
    }
#endif
    sx->outstanding = 10; /* minimum packet size is 10 */
    sx->outp = socksreq;
    sxstate(data, CONNECT_REQ_READ);
    /* FALLTHROUGH */
  case CONNECT_REQ_READ:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to receive SOCKS5 connect request ack.");
      return CURLPX_RECV_REQACK;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }

    if(socksreq[0] != 5) { /* version */
      failf(data,
            "SOCKS5 reply has wrong version, version should be 5.");
      return CURLPX_BAD_VERSION;
    }
    else if(socksreq[1]) { /* Anything besides 0 is an error */
      CURLproxycode rc = CURLPX_REPLY_UNASSIGNED;
      int code = socksreq[1];
      failf(data, "Can't complete SOCKS5 connection to %s. (%d)",
            hostname, (unsigned char)socksreq[1]);
      if(code < 9) {
        /* RFC 1928 section 6 lists: */
        static const CURLproxycode lookup[] = {
          CURLPX_OK,
          CURLPX_REPLY_GENERAL_SERVER_FAILURE,
          CURLPX_REPLY_NOT_ALLOWED,
          CURLPX_REPLY_NETWORK_UNREACHABLE,
          CURLPX_REPLY_HOST_UNREACHABLE,
          CURLPX_REPLY_CONNECTION_REFUSED,
          CURLPX_REPLY_TTL_EXPIRED,
          CURLPX_REPLY_COMMAND_NOT_SUPPORTED,
          CURLPX_REPLY_ADDRESS_TYPE_NOT_SUPPORTED,
        };
        rc = lookup[code];
      }
      return rc;
    }

    /* Fix: in general, returned BND.ADDR is variable length parameter by RFC
       1928, so the reply packet should be read until the end to avoid errors
       at subsequent protocol level.

       +----+-----+-------+------+----------+----------+
       |VER | REP |  RSV  | ATYP | BND.ADDR | BND.PORT |
       +----+-----+-------+------+----------+----------+
       | 1  |  1  | X'00' |  1   | Variable |    2     |
       +----+-----+-------+------+----------+----------+

       ATYP:
       o  IP v4 address: X'01', BND.ADDR = 4 byte
       o  domain name:  X'03', BND.ADDR = [ 1 byte length, string ]
       o  IP v6 address: X'04', BND.ADDR = 16 byte
    */

    /* Calculate real packet size */
    if(socksreq[3] == 3) {
      /* domain name */
      int addrlen = (int) socksreq[4];
      len = 5 + addrlen + 2;
    }
    else if(socksreq[3] == 4) {
      /* IPv6 */
      len = 4 + 16 + 2;
    }
    else if(socksreq[3] == 1) {
      len = 4 + 4 + 2;
    }
    else {
      failf(data, "SOCKS5 reply has wrong address type.");
      return CURLPX_BAD_ADDRESS_TYPE;
    }

    /* At this point we already read first 10 bytes */
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    if(!conn->socks5_gssapi_enctype) {
      /* decrypt_gssapi_blockread already read the whole packet */
#endif
      if(len > 10) {
        sx->outstanding = len - 10; /* get the rest */
        sx->outp = &socksreq[10];
        sxstate(data, CONNECT_REQ_READ_MORE);
      }
      else {
        sxstate(data, CONNECT_DONE);
        break;
      }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
    }
#endif
    /* FALLTHROUGH */
  case CONNECT_REQ_READ_MORE:
    result = Curl_read_plain(sockfd, (char *)sx->outp,
                             sx->outstanding, &actualread);
    if(result && (CURLE_AGAIN != result)) {
      failf(data, "Failed to receive SOCKS5 connect request ack.");
      return CURLPX_RECV_ADDRESS;
    }
    else if(!result && !actualread) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    else if(actualread != sx->outstanding) {
      /* remain in state */
      sx->outstanding -= actualread;
      sx->outp += actualread;
      return CURLPX_OK;
    }
    sxstate(data, CONNECT_DONE);
  }
  infof(data, "SOCKS5 request granted.");

  *done = TRUE;
  return CURLPX_OK; /* Proxy was successful! */
}